

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void llvm::APInt::sdivrem(APInt *LHS,int64_t RHS,APInt *Quotient,int64_t *Remainder)

{
  bool bVar1;
  APInt local_70;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  uint64_t local_30;
  uint64_t R;
  int64_t *Remainder_local;
  APInt *Quotient_local;
  int64_t RHS_local;
  APInt *LHS_local;
  
  local_30 = *Remainder;
  R = (uint64_t)Remainder;
  Remainder_local = (int64_t *)Quotient;
  Quotient_local = (APInt *)RHS;
  RHS_local = (int64_t)LHS;
  bVar1 = isNegative(LHS);
  if (bVar1) {
    if ((long)Quotient_local < 0) {
      APInt(&local_50,(APInt *)RHS_local);
      llvm::operator-((llvm *)&local_40,&local_50);
      udivrem(&local_40,-(long)Quotient_local,(APInt *)Remainder_local,&local_30);
      ~APInt(&local_40);
      ~APInt(&local_50);
    }
    else {
      APInt(&local_70,(APInt *)RHS_local);
      llvm::operator-((llvm *)&local_60,&local_70);
      udivrem(&local_60,(uint64_t)Quotient_local,(APInt *)Remainder_local,&local_30);
      ~APInt(&local_60);
      ~APInt(&local_70);
      negate((APInt *)Remainder_local);
    }
    local_30 = -local_30;
  }
  else if ((long)Quotient_local < 0) {
    udivrem((APInt *)RHS_local,-(long)Quotient_local,(APInt *)Remainder_local,&local_30);
    negate((APInt *)Remainder_local);
  }
  else {
    udivrem((APInt *)RHS_local,(uint64_t)Quotient_local,(APInt *)Remainder_local,&local_30);
  }
  *(uint64_t *)R = local_30;
  return;
}

Assistant:

void APInt::sdivrem(const APInt &LHS, int64_t RHS,
                    APInt &Quotient, int64_t &Remainder) {
  uint64_t R = Remainder;
  if (LHS.isNegative()) {
    if (RHS < 0)
      APInt::udivrem(-LHS, -RHS, Quotient, R);
    else {
      APInt::udivrem(-LHS, RHS, Quotient, R);
      Quotient.negate();
    }
    R = -R;
  } else if (RHS < 0) {
    APInt::udivrem(LHS, -RHS, Quotient, R);
    Quotient.negate();
  } else {
    APInt::udivrem(LHS, RHS, Quotient, R);
  }
  Remainder = R;
}